

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::ReadBytes(CodedInputStream *input,string **p)

{
  byte bVar1;
  pointer __dest;
  bool bVar2;
  string *buffer;
  byte *pbVar3;
  LogMessage *other;
  ulong uVar4;
  byte *pbVar5;
  uint32 first_byte_or_zero;
  LogFinisher local_59;
  LogMessage local_58;
  
  buffer = *p;
  if (buffer == (string *)&fixed_address_empty_string_abi_cxx11_) {
    buffer = (string *)operator_new(0x20);
    (buffer->_M_dataplus)._M_p = (pointer)&buffer->field_2;
    buffer->_M_string_length = 0;
    (buffer->field_2)._M_local_buf[0] = '\0';
    *p = buffer;
  }
  pbVar3 = input->buffer_;
  pbVar5 = input->buffer_end_;
  if (pbVar3 < pbVar5) {
    bVar1 = *pbVar3;
    uVar4 = (ulong)bVar1;
    first_byte_or_zero = (uint32)bVar1;
    if (-1 < (char)bVar1) {
      pbVar3 = pbVar3 + 1;
      input->buffer_ = pbVar3;
      goto LAB_002c896e;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  uVar4 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
  if ((uVar4 & 0x8000000080000000) != 0) {
    return false;
  }
  pbVar3 = input->buffer_;
  pbVar5 = input->buffer_end_;
LAB_002c896e:
  if ((int)uVar4 <= (int)pbVar5 - (int)pbVar3) {
    uVar4 = uVar4 & 0xffffffff;
    std::__cxx11::string::resize((ulong)buffer,(char)uVar4);
    __dest = (buffer->_M_dataplus)._M_p;
    if (__dest == (pointer)0x0) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream_inl.h"
                 ,0x3c);
      other = LogMessage::operator<<(&local_58,"CHECK failed: z.first != NULL: ");
      LogFinisher::operator=(&local_59,other);
      LogMessage::~LogMessage(&local_58);
    }
    memcpy(__dest,input->buffer_,uVar4);
    input->buffer_ = input->buffer_ + uVar4;
    return true;
  }
  bVar2 = io::CodedInputStream::ReadStringFallback(input,buffer,(int)uVar4);
  return bVar2;
}

Assistant:

bool WireFormatLite::ReadBytes(io::CodedInputStream* input, string** p) {
  if (*p == &::google::protobuf::internal::GetEmptyStringAlreadyInited()) {
    *p = new ::std::string();
  }
  return ReadBytesToString(input, *p);
}